

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::deepCopy
          (RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this,
          AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
          *sr)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar6;
  undefined4 extraout_var_01;
  long *plVar7;
  
  iVar5 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])(sr);
  plVar7 = *(long **)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])(sr);
  if (plVar7 != *(long **)(CONCAT44(extraout_var_00,iVar5) + 8)) {
    do {
      puVar6 = (undefined8 *)operator_new(0x20);
      lVar1 = *plVar7;
      *puVar6 = &PTR__HitCounter_00125888;
      puVar6[1] = *(undefined8 *)(lVar1 + 8);
      uVar2 = *(undefined4 *)(lVar1 + 0x14);
      uVar3 = *(undefined4 *)(lVar1 + 0x18);
      uVar4 = *(undefined4 *)(lVar1 + 0x1c);
      *(undefined4 *)(puVar6 + 2) = *(undefined4 *)(lVar1 + 0x10);
      *(undefined4 *)((long)puVar6 + 0x14) = uVar2;
      *(undefined4 *)(puVar6 + 3) = uVar3;
      *(undefined4 *)((long)puVar6 + 0x1c) = uVar4;
      (*(this->
        super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
        ).super_ThreadSafe._vptr_ThreadSafe[0x10])(this,puVar6);
      plVar7 = plVar7 + 1;
      iVar5 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])(sr);
    } while (plVar7 != *(long **)(CONCAT44(extraout_var_01,iVar5) + 8));
  }
  return;
}

Assistant:

virtual void deepCopy(const AbstractRegistry<T_Ptr, std::vector<T_Ptr*>>& sr) {
    for (const_iterator it = sr.list().begin(); it != sr.list().end(); ++it) {
      registerNew(new T_Ptr(**it));
    }
  }